

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_lctlg(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  bool bVar1;
  uint64_t uVar2;
  CPUState *pCVar3;
  uintptr_t unaff_retaddr;
  uint64_t val;
  uint64_t uStack_40;
  uint32_t i;
  uint64_t src;
  _Bool PERchanged;
  uintptr_t ra;
  uint32_t r3_local;
  uint64_t a2_local;
  uint32_t r1_local;
  CPUS390XState_conflict *env_local;
  
  bVar1 = false;
  val._4_4_ = r1;
  uStack_40 = a2;
  if ((a2 & 7) == 0) {
    while( true ) {
      uVar2 = cpu_ldq_data_ra_s390x(env,uStack_40,unaff_retaddr);
      if (((env->cregs[val._4_4_] != uVar2) && (8 < val._4_4_)) && (val._4_4_ < 0xc)) {
        bVar1 = true;
      }
      env->cregs[val._4_4_] = uVar2;
      uStack_40 = uStack_40 + 8;
      if (val._4_4_ == r3) break;
      val._4_4_ = val._4_4_ + 1 & 0xf;
    }
    if ((bVar1) && (((env->psw).mask & 0x4000000000000000) != 0)) {
      pCVar3 = env_cpu(env);
      s390_cpu_recompute_watchpoints(pCVar3);
    }
    pCVar3 = env_cpu(env);
    tlb_flush_s390x(pCVar3);
    return;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

void HELPER(lctlg)(CPUS390XState *env, uint32_t r1, uint64_t a2, uint32_t r3)
{
    uintptr_t ra = GETPC();
    bool PERchanged = false;
    uint64_t src = a2;
    uint32_t i;

    if (src & 0x7) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    for (i = r1;; i = (i + 1) % 16) {
        uint64_t val = cpu_ldq_data_ra(env, src, ra);
        if (env->cregs[i] != val && i >= 9 && i <= 11) {
            PERchanged = true;
        }
        env->cregs[i] = val;
        HELPER_LOG("load ctl %d from 0x%" PRIx64 " == 0x%" PRIx64 "\n",
                   i, src, val);
        src += sizeof(uint64_t);

        if (i == r3) {
            break;
        }
    }

    if (PERchanged && env->psw.mask & PSW_MASK_PER) {
        s390_cpu_recompute_watchpoints(env_cpu(env));
    }

    tlb_flush(env_cpu(env));
}